

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::serializedata<std::__cxx11::string_const,std::vector<int,std::allocator<int>>const>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          vector<int,_std::allocator<int>_> *args_1)

{
  Options OVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  undefined7 in_stack_fffffffffffffd20;
  string local_2d8 [24];
  Options *in_stack_fffffffffffffd40;
  ostream *in_stack_fffffffffffffd48;
  PortableBinaryOutputArchive *in_stack_fffffffffffffd50;
  ostringstream local_190 [400];
  
  args_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            ((OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *)
             CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd20),args_00,
             (vector<int,_std::allocator<int>_> *)in_RDI);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata((binarydata *)in_RDI,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_2d8);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x354f3a);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return (binarydata *)args_00;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }